

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

void TestObject::Visit<StressTester::Run()::__0>
               (Recycler *recycler,TestObject *root,anon_class_8_1_a8a4b1a8 fn)

{
  TestObject *this;
  bool bVar1;
  int iVar2;
  Recycler *pRVar3;
  BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01;
  WriteBarrierPtr *this_02;
  TestObject **ppTVar4;
  bool local_c1;
  TestObject *local_c0;
  TestObject *obj;
  TestObject *pTStack_b0;
  int i;
  TestObject *curr;
  int numObjects;
  undefined8 local_98;
  TrackAllocData local_90;
  List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *local_68;
  ObjectList_t *objectList;
  undefined8 local_58;
  TrackAllocData local_50;
  BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_28;
  ObjectTracker_t *objectTracker;
  TestObject *root_local;
  Recycler *recycler_local;
  anon_class_8_1_a8a4b1a8 fn_local;
  
  objectTracker = (ObjectTracker_t *)root;
  root_local = (TestObject *)recycler;
  recycler_local = (Recycler *)fn.stack;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,
             (type_info *)
             &JsUtil::
              BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
             ,0x6c);
  pRVar3 = Memory::Recycler::TrackAllocInfo(recycler,&local_50);
  objectList = (ObjectList_t *)Memory::Recycler::AllocInlined;
  local_58 = 0;
  this_00 = (BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar3,0x43c4b0);
  JsUtil::
  BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,(AllocatorType *)root_local,0);
  this = root_local;
  local_28 = this_00;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,
             (type_info *)
             &JsUtil::List<TestObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
             ,0x6d);
  pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_90);
  _numObjects = Memory::Recycler::AllocInlined;
  local_98 = 0;
  this_01 = (List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
            new<Memory::Recycler>(0x30,pRVar3,0x43c4b0);
  JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::List
            (this_01,(Recycler *)root_local,4);
  local_68 = this_01;
  JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (this_01,(TestObject **)&objectTracker);
  curr._7_1_ = 1;
  JsUtil::
  BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Add(local_28,(TestObject **)&objectTracker,(bool *)((long)&curr + 7));
  curr._0_4_ = 0;
  while( true ) {
    iVar2 = JsUtil::ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>::Count
                      (&local_68->
                        super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>);
    if (iVar2 < 1) break;
    this_02 = (WriteBarrierPtr *)
              JsUtil::
              List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
              Item(local_68,0);
    ppTVar4 = Memory::WriteBarrierPtr::operator_cast_to_TestObject__(this_02);
    pTStack_b0 = *ppTVar4;
    JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    RemoveAt(local_68,0);
    CheckCookie(pTStack_b0);
    for (obj._4_4_ = 0; obj._4_4_ < pTStack_b0->pointerCount; obj._4_4_ = obj._4_4_ + 1) {
      local_c0 = Get(pTStack_b0,obj._4_4_);
      if (local_c0 != (TestObject *)0x0) {
        bVar1 = JsUtil::
                BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(local_28,&local_c0);
        if (!bVar1) {
          local_c1 = true;
          JsUtil::
          BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Add(local_28,&local_c0,&local_c1);
          JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(local_68,&local_c0);
        }
      }
    }
    curr._0_4_ = (int)curr + 1;
  }
  JsUtil::
  BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Map<TestObject::Visit<StressTester::Run()::__0>(Memory::Recycler*,TestObject*,StressTester::Run()::__0)::_lambda(TestObject*,bool)_1_>
            ((BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)local_28,(anon_class_8_1_a8a4b1a8 *)&recycler_local);
  return;
}

Assistant:

void TestObject::Visit(Recycler *recycler, TestObject *root, Fn fn)
{
    // TODO: move these allocations to HeapAllocator.

    ObjectTracker_t *objectTracker = RecyclerNew(recycler, ObjectTracker_t, recycler);
    ObjectList_t *objectList = RecyclerNew(recycler, ObjectList_t, recycler);

    // Prime the list with the first object
    objectList->Add(root);
    objectTracker->Add(root, true);

    int numObjects = 0;
    while (objectList->Count() > 0)
    {
        TestObject *curr = objectList->Item(0);
        objectList->RemoveAt(0);

        curr->CheckCookie();
        for (int i = 0; i < curr->pointerCount; ++i)
        {
            TestObject *obj = curr->Get(i);
            if (obj != nullptr /*&& IsAligned<64>(obj)*/ && !objectTracker->ContainsKey(obj))
            {
                objectTracker->Add(obj, true);
                objectList->Add(obj);
            }
        }

        ++numObjects;
    }

    objectTracker->Map([&](TestObject * val, bool) {
        fn(val);
    });

}